

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::reconstructPublicKey(OSSLRSA *this,PublicKey **ppPublicKey,ByteString *serialisedData)

{
  uint uVar1;
  size_t sVar2;
  OSSLRSAPublicKey *this_00;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  OSSLRSAPublicKey *pub;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar2 = ByteString::size((ByteString *)0x1c1f05), sVar2 != 0)) {
    this_00 = (OSSLRSAPublicKey *)operator_new(0x60);
    OSSLRSAPublicKey::OSSLRSAPublicKey(this_00);
    uVar1 = (*(this_00->super_RSAPublicKey).super_PublicKey.super_Serialisable._vptr_Serialisable
              [10])(this_00,in_RDX);
    if ((uVar1 & 1) == 0) {
      if (this_00 != (OSSLRSAPublicKey *)0x0) {
        (*(this_00->super_RSAPublicKey).super_PublicKey.super_Serialisable._vptr_Serialisable[2])();
      }
      return false;
    }
    *in_RSI = this_00;
    return true;
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructPublicKey(PublicKey** ppPublicKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPublicKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLRSAPublicKey* pub = new OSSLRSAPublicKey();

	if (!pub->deserialise(serialisedData))
	{
		delete pub;

		return false;
	}

	*ppPublicKey = pub;

	return true;
}